

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

unsigned_short ndiGetBX2PortStatus(ndicapi *pol,int portHandle)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = pol->Bx2HandleCount;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    do {
      if ((uint)pol->Bx2Handles[uVar2] == portHandle) goto LAB_00109d37;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    uVar2 = (ulong)uVar1;
  }
LAB_00109d37:
  if ((uint)uVar2 == uVar1) {
    return 0;
  }
  return pol->Bx2HandlesStatus[uVar2 & 0xffffffff];
}

Assistant:

ndicapiExport unsigned short ndiGetBX2PortStatus(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->Bx2HandlesStatus[i];
}